

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

bool __thiscall tinyxml2::XMLPrinter::Visit(XMLPrinter *this,XMLText *text)

{
  bool cdata;
  char *text_00;
  XMLText *text_local;
  XMLPrinter *this_local;
  
  text_00 = XMLNode::Value(&text->super_XMLNode);
  cdata = XMLText::CData(text);
  PushText(this,text_00,cdata);
  return true;
}

Assistant:

bool XMLPrinter::Visit( const XMLText& text )
{
    PushText( text.Value(), text.CData() );
    return true;
}